

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexer.cpp
# Opt level: O1

void __thiscall Indexer::register_dataset(Indexer *this,string *dataset_name)

{
  DatabaseSnapshot *pDVar1;
  pointer pcVar2;
  OnDiskDataset *this_00;
  _Head_base<0UL,_OnDiskDataset_*,_false> local_50;
  string local_48;
  
  pDVar1 = this->snap;
  this_00 = (OnDiskDataset *)operator_new(0x148);
  pcVar2 = (dataset_name->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + dataset_name->_M_string_length);
  OnDiskDataset::OnDiskDataset(this_00,&pDVar1->db_base,&local_48);
  local_50._M_head_impl = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>,std::allocator<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>>>
  ::emplace_back<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>>
            ((vector<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>,std::allocator<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>>>
              *)&this->created_datasets,
             (unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)&local_50);
  if (local_50._M_head_impl != (OnDiskDataset *)0x0) {
    std::default_delete<OnDiskDataset>::operator()
              ((default_delete<OnDiskDataset> *)&local_50,local_50._M_head_impl);
  }
  return;
}

Assistant:

void Indexer::register_dataset(const std::string &dataset_name) {
    created_datasets.emplace_back(
        std::make_unique<OnDiskDataset>(snap->db_base, dataset_name));
}